

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O0

MPP_RET h264e_vepu_mbrc_setup(HalH264eVepuMbRcCtx ctx,MppEncCfgSet *cfg)

{
  RK_S32 RVar1;
  int local_44;
  bool local_3d;
  MppEncHwCfg *hw_cfg;
  MppEncRcCfg *rc;
  MppEncPrepCfg *prep;
  HalH264eVepuMbRcImpl *p;
  MppEncCfgSet *cfg_local;
  HalH264eVepuMbRcCtx ctx_local;
  
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","enter\n","h264e_vepu_mbrc_setup");
  }
  *(RK_S32 *)ctx = (cfg->prep).width;
  *(RK_S32 *)((long)ctx + 4) = (cfg->prep).height;
  *(int *)((long)ctx + 8) =
       (int)((long)((long)((cfg->prep).width + 0xf) & 0xfffffffffffffff0U) / 0x10);
  *(int *)((long)ctx + 0xc) =
       (int)((long)((long)((cfg->prep).height + 0xf) & 0xfffffffffffffff0U) / 0x10);
  *(int *)((long)ctx + 0x10) = *ctx * *(int *)((long)ctx + 4);
  *(int *)((long)ctx + 0x14) = *(int *)((long)ctx + 8) * *(int *)((long)ctx + 0xc);
  RVar1 = axb_div_c((cfg->rc).bps_target,(cfg->rc).fps_out_denom,(cfg->rc).fps_out_num);
  *(RK_S32 *)((long)ctx + 0x18) = RVar1;
  if ((*(int *)((long)ctx + 0x10) == 0) &&
     (_mpp_log_l(2,"hal_h264e_vepu_v2","Assertion %s failed at %s:%d\n",(char *)0x0,"p->pels",
                 "h264e_vepu_mbrc_setup",0x212), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if (((cfg->rc).fps_in_num / (cfg->rc).fps_in_denom <
       (cfg->rc).fps_out_num / (cfg->rc).fps_out_denom) &&
     (_mpp_log_l(2,"hal_h264e_vepu_v2","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "rc->fps_out_num / rc->fps_out_denom <= rc->fps_in_num / rc->fps_in_denom",
                 "h264e_vepu_mbrc_setup",0x215), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  *(RK_S32 *)((long)ctx + 0x20) = (cfg->rc).fps_in_num;
  *(RK_S32 *)((long)ctx + 0x24) = (cfg->rc).fps_in_denom;
  *(RK_S32 *)((long)ctx + 0x28) = (cfg->rc).fps_out_num;
  *(RK_S32 *)((long)ctx + 0x2c) = (cfg->rc).fps_out_denom;
  *(RK_S32 *)((long)ctx + 0x34) = (cfg->rc).fps_in_denom * (cfg->rc).fps_out_num;
  *(RK_S32 *)((long)ctx + 0x38) = (cfg->rc).fps_in_num * (cfg->rc).fps_out_denom;
  *(undefined4 *)((long)ctx + 0x30) = *(undefined4 *)((long)ctx + 0x38);
  local_3d = false;
  if ((cfg->hw).mb_rc_disable == 0) {
    local_3d = (cfg->rc).rc_mode != MPP_ENC_RC_MODE_FIXQP;
  }
  *(uint *)((long)ctx + 0x1c) = (uint)local_3d;
  if ((hal_h264e_debug & 0x100) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","estimated init qp %d\n","h264e_vepu_mbrc_setup",
               (ulong)*(uint *)((long)ctx + 0x4c));
  }
  *(undefined4 *)((long)ctx + 0x3c) = 2;
  *(undefined4 *)((long)ctx + 0x40) = 0x600;
  if (*(int *)((long)ctx + 0x1c) == 0) {
    *(undefined4 *)((long)ctx + 0x44) = 0;
    *(undefined4 *)((long)ctx + 0x48) = 0;
  }
  else {
    if (*(int *)((long)ctx + 0xc) + -1 < 0xb) {
      local_44 = *(int *)((long)ctx + 0xc) + -1;
    }
    else {
      local_44 = 10;
    }
    *(int *)((long)ctx + 0x44) = local_44;
    *(int *)((long)ctx + 0x48) = *(int *)((long)ctx + 0x14) / (*(int *)((long)ctx + 0x44) + 1);
  }
  *(undefined4 *)((long)ctx + 0x50) = 2;
  *(undefined4 *)((long)ctx + 0x54) = 2;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu_v2","leave\n","h264e_vepu_mbrc_setup");
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_mbrc_setup(HalH264eVepuMbRcCtx ctx, MppEncCfgSet*cfg)
{
    HalH264eVepuMbRcImpl *p = (HalH264eVepuMbRcImpl *)ctx;
    MppEncPrepCfg *prep = &cfg->prep;
    MppEncRcCfg *rc = &cfg->rc;
    MppEncHwCfg* hw_cfg = &cfg->hw;

    hal_h264e_dbg_func("enter\n");

    // get necessary parameter from config
    p->width    = prep->width;
    p->height   = prep->height;
    p->mb_w     = MPP_ALIGN(prep->width, 16) / 16;
    p->mb_h     = MPP_ALIGN(prep->height, 16) / 16;
    p->pels     = p->width * p->height;
    p->mbs      = p->mb_w * p->mb_h;
    p->bits_per_pic = axb_div_c(rc->bps_target, rc->fps_out_denom,
                                rc->fps_out_num);

    mpp_assert(p->pels);

    // frame rate control
    mpp_assert(rc->fps_out_num / rc->fps_out_denom <= rc->fps_in_num / rc->fps_in_denom);

    p->fps_in_num       = rc->fps_in_num;
    p->fps_in_denom    = rc->fps_in_denom;
    p->fps_out_num      = rc->fps_out_num;
    p->fps_out_denom   = rc->fps_out_denom;

    p->fps_step         = rc->fps_in_denom * rc->fps_out_num;
    p->fps_threshold    = rc->fps_in_num * rc->fps_out_denom;
    p->fps_count        = p->fps_threshold;

    // if not constant
    p->mb_bit_rc_enable = !hw_cfg->mb_rc_disable && (rc->rc_mode != MPP_ENC_RC_MODE_FIXQP);

    hal_h264e_dbg_rc("estimated init qp %d\n", p->qp_init_est);

    // init first frame mad parameter
    p->mad_qp_change = 2;
    p->mad_threshold = 256 * 6;

    // init check point position
    if (p->mb_bit_rc_enable) {
        p->check_point_count = MPP_MIN(p->mb_h - 1, VEPU_CHECK_POINTS_MAX);
        p->check_point_distance = p->mbs / (p->check_point_count + 1);
    } else {
        p->check_point_count = 0;
        p->check_point_distance = 0;
    }

    p->frame_type = INTRA_FRAME;
    p->pre_frame_type = INTRA_FRAME;

    hal_h264e_dbg_func("leave\n");
    return MPP_OK;
}